

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

err_t MetaUnSet(node *p,dataid Id,void *Data,size_t Size)

{
  char cVar1;
  long *plVar2;
  dataid dVar3;
  char *p_00;
  fourcc_t PartOfClass;
  dataid *pdVar4;
  size_t sVar5;
  void *pvVar6;
  bool_t bVar7;
  err_t eVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  dataflags Type;
  array *p_01;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  uint *puVar17;
  bool_t v;
  
  plVar2 = *(long **)((long)p->VMT + -0x18);
  if (plVar2 != (long *)0x0) {
    lVar15 = *plVar2;
    lVar14 = 0;
    while (lVar14 <= lVar15) {
      uVar13 = (ulong)(lVar14 + lVar15) >> 1;
      uVar10 = plVar2[uVar13 * 2 + 1];
      if (Id < uVar10) {
        lVar15 = uVar13 - 1;
      }
      else {
        if (Id <= uVar10) {
          puVar17 = (uint *)(plVar2 + uVar13 * 2 + 1)[1];
          cVar1 = (char)*puVar17;
          if (cVar1 == '&') goto LAB_001198a3;
          if (cVar1 == '*') {
            eVar8 = (**(code **)(puVar17 + 2))(p,Id,Data,Size);
            return eVar8;
          }
          uVar10 = uVar13;
          puVar16 = puVar17;
          if (cVar1 == '-') {
            for (pdVar4 = (dataid *)(plVar2 + ((lVar14 + lVar15 & 0xfffffffffffffffeU) - 1));
                (0 < (long)uVar13 && (*pdVar4 == Id)); pdVar4 = pdVar4 + -2) {
              uVar13 = uVar13 - 1;
            }
            if ((long)uVar13 < 1) {
              uVar13 = 0;
            }
            lVar15 = uVar13 - 1;
            pdVar4 = (dataid *)(plVar2 + uVar13 * 2 + 3);
            do {
              if (*(char *)pdVar4[-1] != '-') {
                __assert_fail("Lookup[Mid].Meta->Meta==META_PARAM_EVENT",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                              ,0x944,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
              }
              lVar14 = (**(code **)((char *)pdVar4[-1] + 8))(p,Id);
              if (lVar14 != 0) {
                return lVar14;
              }
              lVar15 = lVar15 + 1;
              if (*plVar2 <= lVar15) {
                return 0;
              }
              dVar3 = *pdVar4;
              pdVar4 = pdVar4 + 2;
            } while (dVar3 == Id);
            return 0;
          }
          goto LAB_0011986f;
        }
        lVar14 = uVar13 + 1;
      }
    }
  }
  return -4;
LAB_0011986f:
  uVar11 = *puVar16;
  if ((uVar11 & 0xc0) != 0x40) {
    __assert_fail("(m->Meta & META_MODE_MASK)==META_MODE_DATA",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x952,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
  }
  if ((char)puVar16[4] != '\x02') {
    Type = (dataflags)(uVar11 & 0x7f);
    lVar15 = *(long *)(puVar16 + 2);
    uVar12 = 0;
LAB_001198d0:
    puVar17 = puVar16;
    if (lVar15 < 0) {
      sVar5 = Node_DataSize(p,Id,Type,Data,0x2a);
      uVar10 = (ulong)((uint)Type & 0x3f);
      if ((uVar10 != 4) && (Size < sVar5)) {
        return -3;
      }
      if ((uVar12 & 2) != 0) {
        pvVar6 = Node_GetData(p,Id,uVar10);
        bVar7 = Node_EqData(p,Id,Type,Data,pvVar6);
        if (bVar7 != 0) {
          return 0;
        }
      }
      if ((char)puVar16[4] == '\x03') {
        __assert_fail("m[1].Meta != META_PARAM_DATA_RELEASE",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x97c,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
      }
      if (p == (node *)0x0) {
        __assert_fail("(const void*)(p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x97f,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
      }
      (**(code **)((long)p->VMT + 0x40))(p,Id,uVar10,Data);
    }
    else {
      sVar5 = Node_MaxDataSize(p,Id,Type,0x2a);
      uVar11 = (uint)Type & 0x3f;
      if (sVar5 != Size && (Data != (void *)0x0 && (ulong)uVar11 != 4)) {
        __assert_fail("(Type & TYPE_MASK) == TYPE_STRING || !Data || Size == DataSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                      ,0x987,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
      }
      if (((uVar11 != 4) && (Data != (void *)0x0)) && (sVar5 != Size)) {
        return -3;
      }
      p_01 = (array *)((long)&p->FourCC + lVar15);
      if ((uVar12 & 2) != 0) {
        if (uVar11 == 0x18) {
          if ((plVar2[uVar10 * 2 + 3] != Id) || (*(char *)plVar2[uVar10 * 2 + 4] != '&')) {
            __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                          ,0x990,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
          }
          v = (bool_t)((*(uint *)((char *)plVar2[uVar10 * 2 + 4] + 8) & *(uint *)&p_01->_Begin) != 0
                      );
          lVar15 = EqData(0x18,&v,Data,sVar5);
        }
        else {
          lVar15 = EqData((ulong)uVar11,p_01,Data,sVar5);
        }
        if (lVar15 != 0) {
          return 0;
        }
      }
      if ((char)puVar16[4] == '\x03') {
        puVar17 = puVar16 + 4;
        (**(code **)(puVar16 + 6))(p,Id);
      }
      if (uVar11 == 0x1e) {
        ArrayCopy(p_01,(array *)Data);
      }
      else if (uVar11 == 0x17) {
        if (Data == (void *)0x0) {
          pcVar9 = p_01->_Begin;
          if (pcVar9 == (char *)0x0) goto LAB_00119c6e;
          p_01->_Begin = (char *)0x0;
        }
        else {
          p_00 = *Data;
          pcVar9 = p_01->_Begin;
          if (pcVar9 == p_00) goto LAB_00119c6e;
          if (p_00 != (char *)0x0) {
            Node_AddRef(p_00);
          }
          p_01->_Begin = p_00;
          if (pcVar9 == (char *)0x0) goto LAB_00119c6e;
        }
        Node_Release(pcVar9);
      }
      else if (uVar11 == 0x18) {
        if ((plVar2[uVar10 * 2 + 3] != Id) || (*(char *)plVar2[uVar10 * 2 + 4] != '&')) {
          __assert_fail("Lookup[Mid+1].Id == Id && Lookup[Mid+1].Meta->Meta==META_PARAM_BIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9b5,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        uVar11 = *(uint *)((char *)plVar2[uVar10 * 2 + 4] + 8);
        if ((Data == (void *)0x0) || (*Data == 0)) {
          *(uint *)&p_01->_Begin = *(uint *)&p_01->_Begin & ~uVar11;
        }
        else {
          *(uint *)&p_01->_Begin = *(uint *)&p_01->_Begin | uVar11;
        }
      }
      else if (uVar11 == 4) {
        if (p == (node *)0x0) {
          __assert_fail("(const void*)(p)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9ad,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        sVar5 = (**(code **)((long)p->VMT + 0x30))(p,Id,0x27);
        if (sVar5 == 0) {
          __assert_fail("DataSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x9ae,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
        }
        pcVar9 = "";
        if (Data != (void *)0x0) {
          pcVar9 = (char *)Data;
        }
        tcscpy_s((tchar_t *)p_01,sVar5,pcVar9);
      }
      else if (Data == (void *)0x0) {
        memset(p_01,0,sVar5);
      }
      else {
        memcpy(p_01,Data,sVar5);
      }
    }
LAB_00119c6e:
    if ((char)puVar17[4] == '\x04') {
      eVar8 = (**(code **)(puVar17 + 6))(p,Id);
    }
    else {
      eVar8 = 0;
    }
    if ((uVar12 & 4) == 0) {
      return eVar8;
    }
    Node_Notify(p,Id);
    return eVar8;
  }
  uVar12 = *(ulong *)(puVar16 + 6);
  if ((uVar12 & 1) == 0) {
    Type = (dataflags)(uVar11 & 0x7f);
    lVar15 = *(long *)(puVar16 + 2);
    puVar16 = puVar16 + 4;
    if ((uVar12 & 8) != 0) {
      if ((uVar11 & 0x3f) == 10) {
        if (Size == 8 && Data != (void *)0x0) {
LAB_00119b43:
          pvVar6 = *Data;
          if (pvVar6 != (void *)0x0) {
            if (p == (node *)0x0) {
              __assert_fail("(const void*)(p)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                            ,0x96b,"err_t MetaUnSet(node *, dataid, const void *, size_t)");
            }
            PartOfClass = (**(code **)((long)p->VMT + 0x30))(p,Id,0x22);
            bVar7 = Node_IsPartOf(pvVar6,PartOfClass);
            if (bVar7 == 0) {
              return -3;
            }
          }
        }
      }
      else if (((Size == 8) && (Data != (void *)0x0)) && ((uVar11 & 0x3f) == 0x17))
      goto LAB_00119b43;
    }
    goto LAB_001198d0;
  }
  uVar10 = uVar13;
  puVar16 = puVar17;
  if (cVar1 == '&') {
LAB_001198a3:
    puVar16 = (uint *)plVar2[(uVar13 - 1) * 2 + 2];
    uVar10 = uVar13 - 1;
  }
  goto LAB_0011986f;
}

Assistant:

static INLINE nodeclass* NodeGetClass(const node* p)
{
    return ((nodeclass*)p->VMT)-1;
}